

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hh
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::
index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::value(index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,uint *k)

{
  bool bVar1;
  invalid_argument *this_00;
  pointer ppVar2;
  undefined1 local_28 [16];
  const_iterator it;
  uint *k_local;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  it.m_ptr = (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)k;
  boost::container::
  flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
  ::find((flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
          *)(local_28 + 8),(key_type *)this);
  boost::container::
  flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
  ::end((flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
         *)local_28);
  bVar1 = boost::container::operator==
                    ((vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
                      *)(local_28 + 8),
                     (vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
                      *)local_28);
  if (!bVar1) {
    ppVar2 = boost::container::
             vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
             ::operator->((vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
                           *)(local_28 + 8));
    return &ppVar2->second;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"key is not indexed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline T const & value(KEY const & k) const
  {
    auto it = _key_map.find(k);
    if (it == _key_map.end())
      throw std::invalid_argument("key is not indexed");
    return it->second;
  }